

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configurator.hpp
# Opt level: O3

void __thiscall Configurator::~Configurator(Configurator *this)

{
  pointer pcVar1;
  
  std::ios_base::~ios_base((ios_base *)&this->field_0x28);
  pcVar1 = (this->configuration)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->configuration).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

~Configurator() {}